

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_TryMergeDrawCmds(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  float *pfVar2;
  ImDrawCmd *pIVar3;
  float *pfVar4;
  int iVar5;
  ImDrawCmd *pIVar6;
  ImVec4 *pIVar7;
  ImVec4 *pIVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pIVar6 = (this->CmdBuffer).Data;
  iVar5 = (this->CmdBuffer).Size;
  pIVar1 = pIVar6 + (long)iVar5 + -2;
  pIVar7 = &pIVar6[(long)iVar5 + -2].ClipRect;
  pfVar2 = &pIVar7->w;
  pIVar3 = pIVar6 + (long)iVar5 + -1;
  auVar10[0] = -(*(char *)&(pIVar3->ClipRect).x == *(char *)&(pIVar1->ClipRect).x);
  auVar10[1] = -(*(char *)((long)&(pIVar3->ClipRect).x + 1) ==
                *(char *)((long)&(pIVar1->ClipRect).x + 1));
  auVar10[2] = -(*(char *)((long)&(pIVar3->ClipRect).x + 2) ==
                *(char *)((long)&(pIVar1->ClipRect).x + 2));
  auVar10[3] = -(*(char *)((long)&(pIVar3->ClipRect).x + 3) ==
                *(char *)((long)&(pIVar1->ClipRect).x + 3));
  auVar10[4] = -(*(char *)&(pIVar3->ClipRect).y == *(char *)&(pIVar1->ClipRect).y);
  auVar10[5] = -(*(char *)((long)&(pIVar3->ClipRect).y + 1) ==
                *(char *)((long)&(pIVar1->ClipRect).y + 1));
  auVar10[6] = -(*(char *)((long)&(pIVar3->ClipRect).y + 2) ==
                *(char *)((long)&(pIVar1->ClipRect).y + 2));
  auVar10[7] = -(*(char *)((long)&(pIVar3->ClipRect).y + 3) ==
                *(char *)((long)&(pIVar1->ClipRect).y + 3));
  auVar10[8] = -(*(char *)&(pIVar3->ClipRect).z == *(char *)&(pIVar1->ClipRect).z);
  auVar10[9] = -(*(char *)((long)&(pIVar3->ClipRect).z + 1) ==
                *(char *)((long)&(pIVar1->ClipRect).z + 1));
  auVar10[10] = -(*(char *)((long)&(pIVar3->ClipRect).z + 2) ==
                 *(char *)((long)&(pIVar1->ClipRect).z + 2));
  auVar10[0xb] = -(*(char *)((long)&(pIVar3->ClipRect).z + 3) ==
                  *(char *)((long)&(pIVar1->ClipRect).z + 3));
  auVar10[0xc] = -(*(char *)&(pIVar3->ClipRect).w == *(char *)&(pIVar1->ClipRect).w);
  auVar10[0xd] = -(*(char *)((long)&(pIVar3->ClipRect).w + 1) ==
                  *(char *)((long)&(pIVar1->ClipRect).w + 1));
  auVar10[0xe] = -(*(char *)((long)&(pIVar3->ClipRect).w + 2) ==
                  *(char *)((long)&(pIVar1->ClipRect).w + 2));
  auVar10[0xf] = -(*(char *)((long)&(pIVar3->ClipRect).w + 3) ==
                  *(char *)((long)&(pIVar1->ClipRect).w + 3));
  pIVar8 = &pIVar6[(long)iVar5 + -1].ClipRect;
  pfVar4 = &pIVar8->w;
  auVar9[0] = -(*(char *)pfVar4 == *(char *)pfVar2);
  auVar9[1] = -(*(char *)((long)&pIVar8->w + 1) == *(char *)((long)&pIVar7->w + 1));
  auVar9[2] = -(*(char *)((long)&pIVar8->w + 2) == *(char *)((long)&pIVar7->w + 2));
  auVar9[3] = -(*(char *)((long)&pIVar8->w + 3) == *(char *)((long)&pIVar7->w + 3));
  auVar9[4] = -(*(char *)(pfVar4 + 1) == *(char *)(pfVar2 + 1));
  auVar9[5] = -(*(undefined1 *)((long)(pIVar8 + 1) + 1) == *(undefined1 *)((long)(pIVar7 + 1) + 1));
  auVar9[6] = -(*(undefined1 *)((long)(pIVar8 + 1) + 2) == *(undefined1 *)((long)(pIVar7 + 1) + 2));
  auVar9[7] = -(*(undefined1 *)((long)(pIVar8 + 1) + 3) == *(undefined1 *)((long)(pIVar7 + 1) + 3));
  auVar9[8] = -(*(char *)(pfVar4 + 2) == *(char *)(pfVar2 + 2));
  auVar9[9] = -(*(undefined1 *)((long)(pIVar8 + 1) + 5) == *(undefined1 *)((long)(pIVar7 + 1) + 5));
  auVar9[10] = -(*(undefined1 *)((long)(pIVar8 + 1) + 6) == *(undefined1 *)((long)(pIVar7 + 1) + 6))
  ;
  auVar9[0xb] = -(*(undefined1 *)((long)(pIVar8 + 1) + 7) == *(undefined1 *)((long)(pIVar7 + 1) + 7)
                 );
  auVar9[0xc] = -(*(char *)(pfVar4 + 3) == *(char *)(pfVar2 + 3));
  auVar9[0xd] = -(*(undefined1 *)((long)(pIVar8 + 1) + 9) == *(undefined1 *)((long)(pIVar7 + 1) + 9)
                 );
  auVar9[0xe] = -(*(undefined1 *)((long)(pIVar8 + 1) + 10) ==
                 *(undefined1 *)((long)(pIVar7 + 1) + 10));
  auVar9[0xf] = -(*(undefined1 *)((long)(pIVar8 + 1) + 0xb) ==
                 *(undefined1 *)((long)(pIVar7 + 1) + 0xb));
  auVar9 = auVar9 & auVar10;
  if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
    if (((pIVar6[(long)iVar5 + -2].IdxOffset + pIVar6[(long)iVar5 + -2].ElemCount ==
          pIVar6[(long)iVar5 + -1].IdxOffset) &&
        (pIVar6[(long)iVar5 + -1].UserCallback == (ImDrawCallback)0x0)) &&
       (pIVar6[(long)iVar5 + -2].UserCallback == (ImDrawCallback)0x0)) {
      pIVar6[(long)iVar5 + -2].ElemCount =
           pIVar6[(long)iVar5 + -2].ElemCount + pIVar6[(long)iVar5 + -1].ElemCount;
      if (0 < iVar5) {
        (this->CmdBuffer).Size = iVar5 + -1;
        return;
      }
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x764,"void ImVector<ImDrawCmd>::pop_back() [T = ImDrawCmd]");
    }
  }
  return;
}

Assistant:

void ImDrawList::_TryMergeDrawCmds()
{
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (ImDrawCmd_HeaderCompare(curr_cmd, prev_cmd) == 0 && ImDrawCmd_AreSequentialIdxOffset(prev_cmd, curr_cmd) && curr_cmd->UserCallback == NULL && prev_cmd->UserCallback == NULL)
    {
        prev_cmd->ElemCount += curr_cmd->ElemCount;
        CmdBuffer.pop_back();
    }
}